

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result wabt::interp::Memory::Copy(Memory *dst,u32 dst_offset,Memory *src,u32 src_offset,u32 size)

{
  bool bVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __result;
  Ref lhs;
  Ref rhs;
  bool local_b1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  dst_end;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_50;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  dst_begin;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  src_end;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_38;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  src_begin;
  u32 size_local;
  u32 src_offset_local;
  Memory *src_local;
  u32 dst_offset_local;
  Memory *dst_local;
  
  src_begin._M_current._0_4_ = size;
  src_begin._M_current._4_4_ = src_offset;
  bVar1 = IsValidAccess(dst,dst_offset,0,(ulong)size);
  if ((bVar1) &&
     (bVar1 = IsValidAccess(src,src_begin._M_current._4_4_,0,(ulong)(u32)src_begin._M_current),
     bVar1)) {
    src_end._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&src->data_);
    local_38 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&src_end,(ulong)src_begin._M_current._4_4_);
    dst_begin._M_current =
         (uchar *)__gnu_cxx::
                  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::operator+(&local_38,(ulong)(u32)src_begin._M_current);
    dst_end._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&dst->data_);
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&dst_end,(ulong)dst_offset);
    __result = __gnu_cxx::
               __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator+(&local_50,(ulong)(u32)src_begin._M_current);
    lhs = Object::self((Object *)src);
    rhs = Object::self((Object *)dst);
    bVar1 = interp::operator==(lhs,rhs);
    local_b1 = false;
    if (bVar1) {
      local_b1 = __gnu_cxx::operator<(&local_38,&local_50);
    }
    if (local_b1 == false) {
      std::
      move<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_38,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )dst_begin._M_current,local_50);
    }
    else {
      std::
      move_backward<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (local_38,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )dst_begin._M_current,__result);
    }
    Result::Result((Result *)((long)&dst_local + 4),Ok);
  }
  else {
    Result::Result((Result *)((long)&dst_local + 4),Error);
  }
  return (Result)dst_local._4_4_;
}

Assistant:

Result Memory::Copy(Memory& dst,
                    u32 dst_offset,
                    const Memory& src,
                    u32 src_offset,
                    u32 size) {
  if (dst.IsValidAccess(dst_offset, 0, size) &&
      src.IsValidAccess(src_offset, 0, size)) {
    auto src_begin = src.data_.begin() + src_offset;
    auto src_end = src_begin + size;
    auto dst_begin = dst.data_.begin() + dst_offset;
    auto dst_end = dst_begin + size;
    if (src.self() == dst.self() && src_begin < dst_begin) {
      std::move_backward(src_begin, src_end, dst_end);
    } else {
      std::move(src_begin, src_end, dst_begin);
    }
    return Result::Ok;
  }
  return Result::Error;
}